

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_array_equal_map(void)

{
  size_type sVar1;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *ppVar2;
  basic_variable<std::allocator<char>_> *pbVar3;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_02;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_03;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_04;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_05;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init_06;
  basic_variable<std::allocator<char>_> *local_8c8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_8b0;
  basic_variable<std::allocator<char>_> *local_898;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_880;
  basic_variable<std::allocator<char>_> *local_868;
  basic_variable<std::allocator<char>_> *local_850;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_838;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_820;
  undefined1 local_815;
  int local_814;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_810;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_808;
  undefined1 local_7a8 [80];
  basic_variable<std::allocator<char>_> local_758;
  basic_variable<std::allocator<char>_> local_728;
  basic_variable<std::allocator<char>_> local_6f8;
  undefined1 local_6c8 [65];
  undefined1 local_687 [2];
  undefined1 local_685;
  int local_684;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_680;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_678;
  undefined1 local_618 [80];
  basic_variable<std::allocator<char>_> local_5c8;
  basic_variable<std::allocator<char>_> local_598;
  basic_variable<std::allocator<char>_> local_568;
  undefined1 local_538 [77];
  undefined1 local_4eb [2];
  undefined1 local_4e9;
  basic_variable<std::allocator<char>_> local_4e8;
  basic_variable<std::allocator<char>_> *local_4b0;
  basic_variable<std::allocator<char>_> local_4a8;
  basic_variable<std::allocator<char>_> local_478;
  basic_variable<std::allocator<char>_> local_448;
  undefined1 local_418 [77];
  undefined1 local_3cb [2];
  undefined1 local_3c9;
  basic_variable<std::allocator<char>_> local_3c8;
  basic_variable<std::allocator<char>_> *local_390;
  basic_variable<std::allocator<char>_> local_388;
  basic_variable<std::allocator<char>_> local_358;
  basic_variable<std::allocator<char>_> local_328;
  undefined1 local_2f8 [65];
  undefined1 local_2b7 [2];
  undefined1 local_2b5;
  int local_2b4;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_2b0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_2a8;
  undefined1 local_248 [64];
  basic_variable<std::allocator<char>_> local_208;
  undefined1 local_1d7 [2];
  undefined1 local_1d5;
  int local_1d4;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_1d0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_1c8;
  undefined1 local_168 [64];
  basic_variable<std::allocator<char>_> local_128;
  undefined1 local_eb [2];
  undefined1 local_e9;
  basic_variable<std::allocator<char>_> local_e8;
  basic_variable<std::allocator<char>_> local_b8;
  undefined1 local_87 [2];
  undefined1 local_85 [13];
  basic_variable<std::allocator<char>_> local_78;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_a[0] = trial::dynamic::operator==(&local_48,&local_78);
  local_85[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == map::make()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd82,"void equality_suite::compare_array_equal_map()",local_a,local_85);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_87[0] = trial::dynamic::operator!=(&local_b8,&local_e8);
  local_e9 = 1;
  sVar1 = 0xd83;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != map::make()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd83,"void equality_suite::compare_array_equal_map()",local_87,&local_e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b8);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_1d0 = &local_1c8;
  local_1d4 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_1d0,(char (*) [6])"alpha",&local_1d4);
  local_168._0_8_ = &local_1c8;
  local_168._8_8_ = 1;
  init._M_len = sVar1;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_168 + 0x10),
             (basic_map<std::allocator<char>_> *)local_168._0_8_,init);
  local_eb[0] = trial::dynamic::operator==
                          (&local_128,(basic_variable<std::allocator<char>_> *)(local_168 + 0x10));
  local_1d5 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == map::make({ {\"alpha\", 1} })","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd84,"void equality_suite::compare_array_equal_map()",local_eb,&local_1d5);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_168 + 0x10));
  ppVar2 = &local_1c8;
  local_820 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_168;
  do {
    local_820 = local_820 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_820);
  } while (local_820 != ppVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_128);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  local_2b0 = &local_2a8;
  local_2b4 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_2b0,(char (*) [6])"alpha",&local_2b4);
  local_248._0_8_ = &local_2a8;
  local_248._8_8_ = 1;
  init_00._M_len = (size_type)ppVar2;
  init_00._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_248 + 0x10),
             (basic_map<std::allocator<char>_> *)local_248._0_8_,init_00);
  local_1d7[0] = trial::dynamic::operator!=
                           (&local_208,(basic_variable<std::allocator<char>_> *)(local_248 + 0x10));
  local_2b5 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != map::make({ {\"alpha\", 1} })","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd85,"void equality_suite::compare_array_equal_map()",local_1d7,&local_2b5);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_248 + 0x10));
  ppVar2 = &local_2a8;
  local_838 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_248;
  do {
    local_838 = local_838 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_838);
  } while (local_838 != ppVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_208);
  local_390 = &local_388;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_390,1);
  local_390 = &local_358;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_390,2);
  local_390 = &local_328;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_390,3);
  local_2f8._0_8_ = &local_388;
  local_2f8._8_8_ = 3;
  init_01._M_len = (size_type)ppVar2;
  init_01._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_2f8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_2f8._0_8_,init_01);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_2b7[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_2f8 + 0x10),&local_3c8);
  local_3c9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == map::make()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd87,"void equality_suite::compare_array_equal_map()",local_2b7,&local_3c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_2f8 + 0x10));
  pbVar3 = &local_388;
  local_850 = (basic_variable<std::allocator<char>_> *)local_2f8;
  do {
    local_850 = local_850 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_850);
  } while (local_850 != pbVar3);
  local_4b0 = &local_4a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_4b0,1);
  local_4b0 = &local_478;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_4b0,2);
  local_4b0 = &local_448;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_4b0,3);
  local_418._0_8_ = &local_4a8;
  local_418._8_8_ = 3;
  init_02._M_len = (size_type)pbVar3;
  init_02._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_418 + 0x10),
             (basic_array<std::allocator<char>_> *)local_418._0_8_,init_02);
  trial::dynamic::basic_map<std::allocator<char>_>::make();
  local_3cb[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_418 + 0x10),&local_4e8);
  local_4e9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != map::make()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd88,"void equality_suite::compare_array_equal_map()",local_3cb,&local_4e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_418 + 0x10));
  pbVar3 = &local_4a8;
  local_868 = (basic_variable<std::allocator<char>_> *)local_418;
  do {
    local_868 = local_868 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_868);
  } while (local_868 != pbVar3);
  local_618._72_8_ = &local_5c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_618._72_8_,1);
  local_618._72_8_ = &local_598;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_618._72_8_,2);
  local_618._72_8_ = &local_568;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_618._72_8_,3);
  local_538._0_8_ = &local_5c8;
  local_538._8_8_ = 3;
  init_03._M_len = (size_type)pbVar3;
  init_03._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_538 + 0x10),
             (basic_array<std::allocator<char>_> *)local_538._0_8_,init_03);
  local_680 = &local_678;
  local_684 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_680,(char (*) [6])"alpha",&local_684);
  local_618._0_8_ = &local_678;
  local_618._8_8_ = 1;
  init_04._M_len = (size_type)pbVar3;
  init_04._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_618 + 0x10),
             (basic_map<std::allocator<char>_> *)local_618._0_8_,init_04);
  local_4eb[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_538 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_618 + 0x10));
  local_685 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == map::make({ {\"alpha\", 1} })","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd89,"void equality_suite::compare_array_equal_map()",local_4eb,&local_685);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_618 + 0x10));
  local_880 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_618;
  do {
    local_880 = local_880 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_880);
  } while (local_880 != &local_678);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_538 + 0x10));
  pbVar3 = &local_5c8;
  local_898 = (basic_variable<std::allocator<char>_> *)local_538;
  do {
    local_898 = local_898 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_898);
  } while (local_898 != pbVar3);
  local_7a8._72_8_ = &local_758;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_7a8._72_8_,1);
  local_7a8._72_8_ = &local_728;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_7a8._72_8_,2);
  local_7a8._72_8_ = &local_6f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_7a8._72_8_,3);
  local_6c8._0_8_ = &local_758;
  local_6c8._8_8_ = 3;
  init_05._M_len = (size_type)pbVar3;
  init_05._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_6c8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_6c8._0_8_,init_05);
  local_810 = &local_808;
  local_814 = 1;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_int,_true>(local_810,(char (*) [6])"alpha",&local_814);
  local_7a8._0_8_ = &local_808;
  local_7a8._8_8_ = 1;
  init_06._M_len = (size_type)pbVar3;
  init_06._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_7a8 + 0x10),
             (basic_map<std::allocator<char>_> *)local_7a8._0_8_,init_06);
  local_687[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_6c8 + 0x10),
                            (basic_variable<std::allocator<char>_> *)(local_7a8 + 0x10));
  local_815 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != map::make({ {\"alpha\", 1} })","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd8a,"void equality_suite::compare_array_equal_map()",local_687,&local_815);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_7a8 + 0x10));
  local_8b0 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_7a8;
  do {
    local_8b0 = local_8b0 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_8b0);
  } while (local_8b0 != &local_808);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_6c8 + 0x10));
  local_8c8 = (basic_variable<std::allocator<char>_> *)local_6c8;
  do {
    local_8c8 = local_8c8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_8c8);
  } while (local_8c8 != &local_758);
  return;
}

Assistant:

void compare_array_equal_map()
{
    TRIAL_PROTOCOL_TEST_EQUAL(array::make() == map::make(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make() != map::make(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make() == map::make({ {"alpha", 1} }), false);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make() != map::make({ {"alpha", 1} }), true);

    TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == map::make(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != map::make(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == map::make({ {"alpha", 1} }), false);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != map::make({ {"alpha", 1} }), true);
}